

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_dparser.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__dest;
  char *pathname;
  int iVar1;
  Grammar *g;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  
  process_args(&arg_state,argv);
  if (arg_state.nfile_arguments != 1) {
    help(&arg_state,(char *)0x0);
  }
  pathname = *arg_state.file_argument;
  g = new_D_Grammar(pathname);
  g->set_op_priority_from_rule = set_op_priority_from_rule;
  g->right_recursive_BNF = right_recursive_BNF;
  g->states_for_whitespace = states_for_whitespace;
  g->states_for_all_nterms = states_for_all_nterms;
  g->tokenizer = tokenizer;
  g->longest_match = longest_match;
  __dest = g->grammar_ident;
  strcpy(__dest,grammar_ident);
  if (ident_from_filename != 0) {
    __s = strrchr(pathname,0x2f);
    if (__s == (char *)0x0) {
      __s = pathname;
    }
    pcVar2 = strchr(__s,0x2e);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(__s);
      pcVar2 = __s + sVar3;
    }
    memcpy(__dest,__s,(long)pcVar2 - (long)__s);
    __dest[(long)pcVar2 - (long)__s] = '\0';
  }
  g->scanner_blocks = scanner_blocks;
  g->scanner_block_size = 0;
  g->write_line_directives = write_line_directives;
  g->write_header = write_header;
  g->token_type = token_type;
  strcpy(g->write_extension,write_extension);
  if (output_file[0] == '\0') {
    strncpy(output_file,pathname,0x3ff);
    sVar3 = strlen(output_file);
    strncat(output_file,".d_parser.",0x3ff - sVar3);
    sVar3 = strlen(output_file);
    strncat(output_file,g->write_extension,0x3ff - sVar3);
  }
  g->write_pathname = output_file;
  g->actions_write_pathname = actions_output_file;
  if (0 < d_rdebug_grammar_level) {
    d_verbose_level = 0;
  }
  mkdparse(g,pathname);
  if (d_rdebug_grammar_level == 0) {
    iVar1 = write_c_tables(g);
    if (iVar1 < 0) {
      d_fail("unable to write C tables \'%s\'",pathname);
    }
  }
  else {
    print_rdebug_grammar(g,pathname);
  }
  free_args(&arg_state);
  free_D_Grammar(g);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  char *grammar_pathname;
  Grammar *g;
  (void)argc;

  process_args(&arg_state, argv);
  if (arg_state.nfile_arguments != 1) help(&arg_state, NULL);
  grammar_pathname = arg_state.file_argument[0];
  g = new_D_Grammar(grammar_pathname);
  /* grammar construction options */
  g->set_op_priority_from_rule = set_op_priority_from_rule;
  g->right_recursive_BNF = right_recursive_BNF;
  g->states_for_whitespace = states_for_whitespace;
  g->states_for_all_nterms = states_for_all_nterms;
  g->tokenizer = tokenizer;
  g->longest_match = longest_match;
  /* grammar writing options */
  strcpy(g->grammar_ident, grammar_ident);
  if (ident_from_filename) {
    char *n = strrchr(grammar_pathname, '/'), *e;
    n = n ? n : grammar_pathname;
    e = strchr(n, '.');
    e = e ? e : n + strlen(n);
    memcpy(g->grammar_ident, n, e - n);
    g->grammar_ident[e - n] = 0;
  }
  g->scanner_blocks = scanner_blocks;
  g->scanner_block_size = scanner_block_size;
  g->write_line_directives = write_line_directives;
  g->write_header = write_header;
  g->token_type = token_type;
  strcpy(g->write_extension, write_extension);

  if (!output_file[0]) {
    strncpy(output_file, grammar_pathname, sizeof(output_file) - 1);
    strncat(output_file, ".d_parser.", sizeof(output_file) - strlen(output_file) - 1);
    strncat(output_file, g->write_extension, sizeof(output_file) - strlen(output_file) - 1);
  }
  g->write_pathname = output_file;
  g->actions_write_pathname = actions_output_file;

  /* don't print anything to stdout, when the grammar is printed there */
  if (d_rdebug_grammar_level > 0) d_verbose_level = 0;

  mkdparse(g, grammar_pathname);

  if (d_rdebug_grammar_level == 0) {
    if (write_c_tables(g) < 0) d_fail("unable to write C tables '%s'", grammar_pathname);
  } else
    print_rdebug_grammar(g, grammar_pathname);

  free_args(&arg_state);
  free_D_Grammar(g);
  g = 0;
  return 0;
}